

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O2

bool __thiscall
pybind11::detail::argument_loader<SupportType>::load_impl_sequence<0ul>
          (argument_loader<SupportType> *this,long call)

{
  handle src;
  bool bVar1;
  reference rVar2;
  
  src.m_ptr = (PyObject *)**(undefined8 **)(call + 8);
  rVar2 = std::vector<bool,_std::allocator<bool>_>::operator[]
                    ((vector<bool,_std::allocator<bool>_> *)(call + 0x20),0);
  bVar1 = type_caster_generic::load_impl<pybind11::detail::type_caster_generic>
                    ((type_caster_generic *)this,src,(*rVar2._M_p & rVar2._M_mask) != 0);
  return bVar1;
}

Assistant:

bool load_impl_sequence(function_call &call, index_sequence<Is...>) {
#ifdef __cpp_fold_expressions
        if ((... || !std::get<Is>(argcasters).load(call.args[Is], call.args_convert[Is])))
            return false;
#else
        for (bool r : {std::get<Is>(argcasters).load(call.args[Is], call.args_convert[Is])...})
            if (!r)
                return false;
#endif
        return true;
    }